

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_clm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int val;
  TCGv_i32 arg3;
  TCGv_i32 ret;
  TCGv_i32 t1;
  TCGv_i32 m3;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  val = get_field1(s,FLD_O_m3,FLD_C_i3);
  arg3 = tcg_const_i32_s390x(tcg_ctx_00,val);
  ret = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx_00,ret,o->in1);
  gen_helper_clm(tcg_ctx_00,tcg_ctx_00->cc_op,tcg_ctx_00->cpu_env,ret,arg3,o->in2);
  set_cc_static(s);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  tcg_temp_free_i32(tcg_ctx_00,arg3);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_clm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 m3 = tcg_const_i32(tcg_ctx, get_field(s, m3));
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, t1, o->in1);
    gen_helper_clm(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, t1, m3, o->in2);
    set_cc_static(s);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, m3);
    return DISAS_NEXT;
}